

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  XmlReporter *this_00;
  string *text;
  long in_RSI;
  long in_RDI;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  bool includeResults;
  AssertionResult *result;
  AssertionResult *in_stack_fffffffffffffb58;
  AssertionResult *in_stack_fffffffffffffb60;
  XmlFormatting XVar5;
  string *in_stack_fffffffffffffb68;
  XmlWriter *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb80;
  AssertionResult *in_stack_fffffffffffffb88;
  XmlWriter *in_stack_fffffffffffffb90;
  AssertionResult *in_stack_fffffffffffffb98;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  XmlFormatting XVar6;
  string *in_stack_fffffffffffffba8;
  XmlWriter *in_stack_fffffffffffffbb0;
  XmlWriter *this_01;
  StringRef *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  XmlWriter *in_stack_fffffffffffffbd0;
  SourceLineInfo *in_stack_fffffffffffffbd8;
  XmlReporter *in_stack_fffffffffffffbe0;
  byte local_371;
  string local_370 [32];
  SourceLineInfo local_350;
  undefined1 local_339 [33];
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [48];
  undefined1 local_2c0 [55];
  allocator<char> local_289;
  string local_288 [32];
  string local_268 [32];
  SourceLineInfo local_248;
  allocator<char> local_231;
  string local_230 [32];
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [48];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [48];
  SourceLineInfo local_160;
  StringRef local_150;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [71];
  allocator<char> local_79;
  string local_78 [48];
  reference local_48;
  MessageInfo *local_40;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_38;
  long local_30;
  byte local_21;
  AssertionResult *local_20;
  long local_18;
  
  local_20 = (AssertionResult *)(in_RSI + 8);
  local_18 = in_RSI;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x148ae4);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  local_371 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(in_stack_fffffffffffffb60);
    local_371 = bVar1 ^ 0xff;
  }
  local_21 = local_371 & 1;
  if (local_21 == 0) {
    OVar3 = AssertionResult::getResultType(local_20);
    XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb78 >> 0x20);
    if (OVar3 != Warning) goto LAB_00148e97;
  }
  local_30 = local_18 + 0x98;
  local_38._M_current =
       (MessageInfo *)
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffb58);
  local_40 = (MessageInfo *)
             clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_fffffffffffffb58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffb60,
                       (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffb58);
    XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb78 >> 0x20);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator*(&local_38);
    if ((local_48->type == Info) && ((local_21 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    else if (local_48->type == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_38);
  }
LAB_00148e97:
  if (((local_21 & 1) != 0) || (OVar3 = AssertionResult::getResultType(local_20), OVar3 == Warning))
  {
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x148ecd);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::startElement
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      AssertionResult::succeeded((AssertionResult *)0x148f8f);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 SUB81((ulong)in_stack_fffffffffffffb60 >> 0x38,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      local_150 = AssertionResult::getTestMacroName(local_20);
      XmlWriter::writeAttribute<Catch::StringRef>
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      local_160 = AssertionResult::getSourceInfo(local_20);
      writeSourceInfo(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,XVar5);
      AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffb88);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      std::__cxx11::string::~string(local_1b8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,XVar5);
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffb98);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      std::__cxx11::string::~string(local_210);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    OVar3 = AssertionResult::getResultType(local_20);
    if (OVar3 == Info) {
      in_stack_fffffffffffffb90 = (XmlWriter *)(in_RDI + 0x170);
      __s = &local_2f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)__s,(allocator<char> *)in_stack_fffffffffffffb90)
      ;
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,XVar5);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb58);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      std::__cxx11::string::~string(local_318);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    else if (OVar3 != Warning) {
      if (OVar3 == ExplicitFailure) {
        in_stack_fffffffffffffb88 = (AssertionResult *)local_339;
        std::allocator<char>::allocator();
        XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                   (allocator<char> *)in_stack_fffffffffffffb90);
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffba0 >> 0x20);
        operator|(Newline,Indent);
        XmlWriter::startElement(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,XVar5);
        std::__cxx11::string::~string((string *)(local_339 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_339);
        local_350 = AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb58);
        operator|(Newline,Indent);
        XmlWriter::writeText(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,XVar6);
        std::__cxx11::string::~string(local_370);
        operator|(Newline,Indent);
        XmlWriter::endElement
                  (in_stack_fffffffffffffb90,
                   (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      }
      else if (OVar3 == ThrewException) {
        this_00 = (XmlReporter *)(in_RDI + 0x170);
        std::allocator<char>::allocator();
        XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                   (allocator<char> *)in_stack_fffffffffffffb90);
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffba0 >> 0x20);
        operator|(Newline,Indent);
        XmlWriter::startElement(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,XVar5);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_231);
        local_248 = AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(this_00,in_stack_fffffffffffffbd8);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb58);
        operator|(Newline,Indent);
        XmlWriter::writeText(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,XVar6);
        std::__cxx11::string::~string(local_268);
        operator|(Newline,Indent);
        XmlWriter::endElement
                  (in_stack_fffffffffffffb90,
                   (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      }
      else if (OVar3 == FatalErrorCondition) {
        std::allocator<char>::allocator();
        XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb60 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                   (allocator<char> *)in_stack_fffffffffffffb90);
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffba0 >> 0x20);
        operator|(Newline,Indent);
        XmlWriter::startElement(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,XVar5);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator(&local_289);
        local_2c0._32_16_ = (undefined1  [16])AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        text = (string *)(in_RDI + 0x170);
        this_01 = (XmlWriter *)local_2c0;
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb58);
        operator|(Newline,Indent);
        XmlWriter::writeText(this_01,text,XVar6);
        std::__cxx11::string::~string((string *)local_2c0);
        operator|(Newline,Indent);
        XmlWriter::endElement
                  (in_stack_fffffffffffffb90,
                   (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      }
    }
    XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x149b93);
    if (bVar1) {
      operator|(Newline,Indent);
      XmlWriter::endElement(in_stack_fffffffffffffb90,XVar5);
    }
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }